

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O2

void __thiscall QAccessibleCache::objectDestroyed(QAccessibleCache *this,QObject *obj)

{
  iterator iVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_> local_40;
  QObject *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = obj;
  QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::valuesImpl<QObject*>
            ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)&local_40,
             (QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)(this + 0x20),
             &local_28);
  iVar1 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::begin
                    ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)&local_40);
  iVar2 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::end
                    ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)&local_40);
  for (; iVar1.i != iVar2.i; iVar1.i = iVar1.i + 1) {
    deleteInterface(this,(iVar1.i)->first,local_28);
  }
  QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleCache::objectDestroyed(QObject* obj)
{
    /*
    In some cases we might add a not fully-constructed object to the cache. This might happen with
    for instance QWidget subclasses that are in the construction phase. If updateAccessibility() is
    called in the constructor of QWidget (directly or indirectly), it will end up asking for the
    classname of that widget in order to know which accessibility interface subclass the
    accessibility factory should instantiate and return. However, since that requires a virtual
    call to metaObject(), it will return the metaObject() of QWidget (not for the subclass), and so
    the factory will ultimately return a rather generic QAccessibleWidget instead of a more
    specialized interface. Even though it is a "incomplete" interface it will be put in the cache
    and it will be usable as if the object is a widget. In order for the cache to not just return
    the same generic QAccessibleWidget for that object, we have to check if the cache matches
    the objects QMetaObject. We therefore use a QMultiHash and also store the QMetaObject * in
    the value. We therefore might potentially store several values for the corresponding object
    (in theory one for each level in the class inheritance chain)

    This means that after the object have been fully constructed, we will at some point again query
    for the interface for the same object, but now its metaObject() returns the correct
    QMetaObject, so it won't return the QAccessibleWidget that is associated with the object in the
    cache. Instead it will go to the factory and create the _correct_ specialized interface for the
    object. If that succeeded, it will also put that entry in the cache. We will therefore in those
    cases insert *two* cache entries for the same object (using QMultiHash). They both must live
    until the object is destroyed.

    So when the object is destroyed we might have to delete two entries from the cache.
    */
    for (auto pair : objectToId.values(obj)) {
        QAccessible::Id id = pair.first;
        Q_ASSERT_X(idToInterface.contains(id), "", "QObject with accessible interface deleted, where interface not in cache!");
        deleteInterface(id, obj);
    }
}